

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

string * __thiscall
ICM::to_string_code<10ul>(string *__return_storage_ptr__,ICM *this,ConstDataPointer data)

{
  Type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  ConstDataPointer data_local;
  
  this_00 = get<10ul>(this);
  TypeBase::to_string_code<std::__cxx11::string>(__return_storage_ptr__,(TypeBase *)this_00,t);
  return __return_storage_ptr__;
}

Assistant:

string to_string_code(ConstDataPointer data) {
		return TypeBase::to_string_code<typename TType<_TU>::Type>(*get<_TU>((void*)data));
	}